

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_asof_join.cpp
# Opt level: O1

void __thiscall
duckdb::AsOfProbeBuffer::ResolveJoin(AsOfProbeBuffer *this,bool *found_match,idx_t *matches)

{
  unique_ptr<duckdb::SBIterator,_std::default_delete<duckdb::SBIterator>,_true> *this_00;
  unique_ptr<duckdb::SBIterator,_std::default_delete<duckdb::SBIterator>,_true> *this_01;
  optional_ptr<duckdb::PartitionGlobalHashGroup,_true> *this_02;
  idx_t iVar1;
  idx_t iVar2;
  idx_t iVar3;
  PartitionGlobalHashGroup *pPVar4;
  sel_t *psVar5;
  int iVar6;
  pointer pSVar7;
  ulong uVar8;
  data_ptr_t pdVar9;
  type pSVar10;
  type pSVar11;
  ulong uVar12;
  type pSVar13;
  idx_t iVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  idx_t iVar18;
  SBScanState *pSVar19;
  
  this->lhs_match_count = 0;
  if ((this->right_itr).
      super_unique_ptr<duckdb::SBIterator,_std::default_delete<duckdb::SBIterator>_>._M_t.
      super___uniq_ptr_impl<duckdb::SBIterator,_std::default_delete<duckdb::SBIterator>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::SBIterator_*,_std::default_delete<duckdb::SBIterator>_>.
      super__Head_base<0UL,_duckdb::SBIterator_*,_false>._M_head_impl != (SBIterator *)0x0) {
    iVar1 = (this->lhs_payload).count;
    this_00 = &this->left_itr;
    pSVar7 = unique_ptr<duckdb::SBIterator,_std::default_delete<duckdb::SBIterator>,_true>::
             operator->(this_00);
    if (iVar1 != 0) {
      this_01 = &this->right_itr;
      iVar2 = pSVar7->entry_idx;
      this_02 = &this->right_hash;
      iVar18 = 0;
      do {
        pSVar7 = unique_ptr<duckdb::SBIterator,_std::default_delete<duckdb::SBIterator>,_true>::
                 operator->(this_00);
        uVar16 = iVar18 + iVar2;
        uVar8 = uVar16 / pSVar7->block_capacity;
        if (uVar8 != (pSVar7->scan).block_idx) {
          pSVar19 = &pSVar7->scan;
          SBScanState::SetIndices(pSVar19,uVar8,0);
          if (uVar8 < pSVar7->block_count) {
            SBScanState::PinRadix(pSVar19,(pSVar7->scan).block_idx);
            pdVar9 = SBScanState::RadixPtr(pSVar19);
            pSVar7->block_ptr = pdVar9;
            if (pSVar7->all_constant == false) {
              pSVar10 = unique_ptr<duckdb::SortedData,_std::default_delete<duckdb::SortedData>,_true>
                        ::operator*(&((pSVar7->scan).sb)->blob_sorting_data);
              SBScanState::PinData(pSVar19,pSVar10);
            }
          }
        }
        uVar8 = uVar16 % pSVar7->block_capacity;
        (pSVar7->scan).entry_idx = uVar8;
        pSVar7->entry_ptr = pSVar7->block_ptr + uVar8 * pSVar7->entry_size;
        pSVar7->entry_idx = uVar16;
        pSVar7 = unique_ptr<duckdb::SBIterator,_std::default_delete<duckdb::SBIterator>,_true>::
                 operator->(this_01);
        pSVar11 = unique_ptr<duckdb::SBIterator,_std::default_delete<duckdb::SBIterator>,_true>::
                  operator*(this_00);
        if (pSVar7->all_constant == true) {
          iVar6 = FastMemcmp(pSVar7->entry_ptr,pSVar11->entry_ptr,
                             pSVar7->sort_layout->comparison_size);
        }
        else {
          iVar6 = Comparators::CompareTuple
                            (&pSVar7->scan,&pSVar11->scan,&pSVar7->entry_ptr,&pSVar11->entry_ptr,
                             pSVar7->sort_layout,&pSVar7->external);
        }
        if (iVar6 <= pSVar7->cmp) {
          pSVar7 = unique_ptr<duckdb::SBIterator,_std::default_delete<duckdb::SBIterator>,_true>::
                   operator->(this_01);
          iVar3 = pSVar7->entry_idx;
          pSVar7 = unique_ptr<duckdb::SBIterator,_std::default_delete<duckdb::SBIterator>,_true>::
                   operator->(this_01);
          uVar8 = iVar3 + 1;
          uVar16 = uVar8 / pSVar7->block_capacity;
          if (uVar16 != (pSVar7->scan).block_idx) {
            pSVar19 = &pSVar7->scan;
            SBScanState::SetIndices(pSVar19,uVar16,0);
            if (uVar16 < pSVar7->block_count) {
              SBScanState::PinRadix(pSVar19,(pSVar7->scan).block_idx);
              pdVar9 = SBScanState::RadixPtr(pSVar19);
              pSVar7->block_ptr = pdVar9;
              if (pSVar7->all_constant == false) {
                pSVar10 = unique_ptr<duckdb::SortedData,_std::default_delete<duckdb::SortedData>,_true>
                          ::operator*(&((pSVar7->scan).sb)->blob_sorting_data);
                SBScanState::PinData(pSVar19,pSVar10);
              }
            }
          }
          uVar16 = uVar8 % pSVar7->block_capacity;
          (pSVar7->scan).entry_idx = uVar16;
          pSVar7->entry_ptr = pSVar7->block_ptr + uVar16 * pSVar7->entry_size;
          pSVar7->entry_idx = uVar8;
          pSVar7 = unique_ptr<duckdb::SBIterator,_std::default_delete<duckdb::SBIterator>,_true>::
                   operator->(this_01);
          iVar14 = pSVar7->entry_idx;
          optional_ptr<duckdb::PartitionGlobalHashGroup,_true>::CheckValid(this_02);
          uVar16 = 1;
          uVar8 = (this_02->ptr->count).super___atomic_base<unsigned_long>._M_i;
          while (iVar14 < uVar8) {
            pSVar7 = unique_ptr<duckdb::SBIterator,_std::default_delete<duckdb::SBIterator>,_true>::
                     operator->(this_01);
            pSVar11 = unique_ptr<duckdb::SBIterator,_std::default_delete<duckdb::SBIterator>,_true>
                      ::operator*(this_00);
            if (pSVar7->all_constant == true) {
              iVar6 = FastMemcmp(pSVar7->entry_ptr,pSVar11->entry_ptr,
                                 pSVar7->sort_layout->comparison_size);
            }
            else {
              iVar6 = Comparators::CompareTuple
                                (&pSVar7->scan,&pSVar11->scan,&pSVar7->entry_ptr,&pSVar11->entry_ptr
                                 ,pSVar7->sort_layout,&pSVar7->external);
            }
            if (pSVar7->cmp < iVar6) break;
            pSVar7 = unique_ptr<duckdb::SBIterator,_std::default_delete<duckdb::SBIterator>,_true>::
                     operator->(this_01);
            uVar8 = iVar3 + uVar16 * 2;
            uVar12 = uVar8 / pSVar7->block_capacity;
            if (uVar12 != (pSVar7->scan).block_idx) {
              pSVar19 = &pSVar7->scan;
              SBScanState::SetIndices(pSVar19,uVar12,0);
              if (uVar12 < pSVar7->block_count) {
                SBScanState::PinRadix(pSVar19,(pSVar7->scan).block_idx);
                pdVar9 = SBScanState::RadixPtr(pSVar19);
                pSVar7->block_ptr = pdVar9;
                if (pSVar7->all_constant == false) {
                  pSVar10 = unique_ptr<duckdb::SortedData,_std::default_delete<duckdb::SortedData>,_true>
                            ::operator*(&((pSVar7->scan).sb)->blob_sorting_data);
                  SBScanState::PinData(pSVar19,pSVar10);
                }
              }
            }
            uVar16 = uVar16 * 2;
            uVar12 = uVar8 % pSVar7->block_capacity;
            (pSVar7->scan).entry_idx = uVar12;
            pSVar7->entry_ptr = pSVar7->block_ptr + uVar12 * pSVar7->entry_size;
            pSVar7->entry_idx = uVar8;
            pSVar7 = unique_ptr<duckdb::SBIterator,_std::default_delete<duckdb::SBIterator>,_true>::
                     operator->(this_01);
            iVar14 = pSVar7->entry_idx;
            optional_ptr<duckdb::PartitionGlobalHashGroup,_true>::CheckValid(this_02);
            uVar8 = (this_02->ptr->count).super___atomic_base<unsigned_long>._M_i;
          }
          uVar12 = (uVar16 >> 1) + iVar3;
          optional_ptr<duckdb::PartitionGlobalHashGroup,_true>::CheckValid(this_02);
          uVar8 = (this_02->ptr->count).super___atomic_base<unsigned_long>._M_i;
          uVar15 = uVar16 + iVar3;
          if (uVar8 <= uVar16 + iVar3) {
            uVar15 = uVar8;
          }
          while (uVar8 = uVar12, uVar8 < uVar15) {
            uVar17 = (uVar15 - uVar8 >> 1) + uVar8;
            pSVar7 = unique_ptr<duckdb::SBIterator,_std::default_delete<duckdb::SBIterator>,_true>::
                     operator->(this_01);
            uVar16 = uVar17 / pSVar7->block_capacity;
            if (uVar16 != (pSVar7->scan).block_idx) {
              pSVar19 = &pSVar7->scan;
              SBScanState::SetIndices(pSVar19,uVar16,0);
              if (uVar16 < pSVar7->block_count) {
                SBScanState::PinRadix(pSVar19,(pSVar7->scan).block_idx);
                pdVar9 = SBScanState::RadixPtr(pSVar19);
                pSVar7->block_ptr = pdVar9;
                if (pSVar7->all_constant == false) {
                  pSVar10 = unique_ptr<duckdb::SortedData,_std::default_delete<duckdb::SortedData>,_true>
                            ::operator*(&((pSVar7->scan).sb)->blob_sorting_data);
                  SBScanState::PinData(pSVar19,pSVar10);
                }
              }
            }
            uVar16 = uVar17 % pSVar7->block_capacity;
            (pSVar7->scan).entry_idx = uVar16;
            pSVar7->entry_ptr = pSVar7->block_ptr + uVar16 * pSVar7->entry_size;
            pSVar7->entry_idx = uVar17;
            pSVar7 = unique_ptr<duckdb::SBIterator,_std::default_delete<duckdb::SBIterator>,_true>::
                     operator->(this_01);
            pSVar11 = unique_ptr<duckdb::SBIterator,_std::default_delete<duckdb::SBIterator>,_true>
                      ::operator*(this_00);
            if (pSVar7->all_constant == true) {
              iVar6 = FastMemcmp(pSVar7->entry_ptr,pSVar11->entry_ptr,
                                 pSVar7->sort_layout->comparison_size);
            }
            else {
              iVar6 = Comparators::CompareTuple
                                (&pSVar7->scan,&pSVar11->scan,&pSVar7->entry_ptr,&pSVar11->entry_ptr
                                 ,pSVar7->sort_layout,&pSVar7->external);
            }
            uVar12 = uVar17 + 1;
            if (pSVar7->cmp < iVar6) {
              uVar12 = uVar8;
              uVar15 = uVar17;
            }
          }
          pSVar7 = unique_ptr<duckdb::SBIterator,_std::default_delete<duckdb::SBIterator>,_true>::
                   operator->(this_01);
          uVar8 = uVar8 - 1;
          uVar16 = uVar8 / pSVar7->block_capacity;
          if (uVar16 != (pSVar7->scan).block_idx) {
            pSVar19 = &pSVar7->scan;
            SBScanState::SetIndices(pSVar19,uVar16,0);
            if (uVar16 < pSVar7->block_count) {
              SBScanState::PinRadix(pSVar19,(pSVar7->scan).block_idx);
              pdVar9 = SBScanState::RadixPtr(pSVar19);
              pSVar7->block_ptr = pdVar9;
              if (pSVar7->all_constant == false) {
                pSVar10 = unique_ptr<duckdb::SortedData,_std::default_delete<duckdb::SortedData>,_true>
                          ::operator*(&((pSVar7->scan).sb)->blob_sorting_data);
                SBScanState::PinData(pSVar19,pSVar10);
              }
            }
          }
          uVar16 = uVar8 % pSVar7->block_capacity;
          (pSVar7->scan).entry_idx = uVar16;
          pSVar7->entry_ptr = pSVar7->block_ptr + uVar16 * pSVar7->entry_size;
          pSVar7->entry_idx = uVar8;
          optional_ptr<duckdb::PartitionGlobalHashGroup,_true>::CheckValid(this_02);
          pPVar4 = this_02->ptr;
          pSVar11 = unique_ptr<duckdb::SBIterator,_std::default_delete<duckdb::SBIterator>,_true>::
                    operator*(this_00);
          pSVar13 = unique_ptr<duckdb::SBIterator,_std::default_delete<duckdb::SBIterator>,_true>::
                    operator*(this_01);
          if ((pPVar4->partition_layout).all_constant == true) {
            iVar6 = FastMemcmp(pSVar11->entry_ptr,pSVar13->entry_ptr,
                               (pPVar4->partition_layout).comparison_size);
          }
          else {
            iVar6 = Comparators::CompareTuple
                              (&pSVar11->scan,&pSVar13->scan,&pSVar11->entry_ptr,&pSVar13->entry_ptr
                               ,&pPVar4->partition_layout,&pSVar11->external);
          }
          if (iVar6 == 0) {
            if (found_match != (bool *)0x0) {
              found_match[iVar18] = true;
            }
            if (matches != (idx_t *)0x0) {
              matches[iVar18] = uVar8;
            }
            psVar5 = (this->lhs_sel).sel_vector;
            iVar3 = this->lhs_match_count;
            this->lhs_match_count = iVar3 + 1;
            psVar5[iVar3] = (sel_t)iVar18;
          }
        }
        iVar18 = iVar18 + 1;
      } while (iVar18 != iVar1);
    }
  }
  return;
}

Assistant:

void AsOfProbeBuffer::ResolveJoin(bool *found_match, idx_t *matches) {
	// If there was no right partition, there are no matches
	lhs_match_count = 0;
	if (!right_itr) {
		return;
	}

	const auto count = lhs_payload.size();
	const auto left_base = left_itr->GetIndex();
	//	Searching for right <= left
	for (idx_t i = 0; i < count; ++i) {
		left_itr->SetIndex(left_base + i);

		//	If right > left, then there is no match
		if (!right_itr->Compare(*left_itr)) {
			continue;
		}

		// Exponential search forward for a non-matching value using radix iterators
		// (We use exponential search to avoid thrashing the block manager on large probes)
		idx_t bound = 1;
		idx_t begin = right_itr->GetIndex();
		right_itr->SetIndex(begin + bound);
		while (right_itr->GetIndex() < right_hash->count) {
			if (right_itr->Compare(*left_itr)) {
				//	If right <= left, jump ahead
				bound *= 2;
				right_itr->SetIndex(begin + bound);
			} else {
				break;
			}
		}

		//	Binary search for the first non-matching value using radix iterators
		//	The previous value (which we know exists) is the match
		auto first = begin + bound / 2;
		auto last = MinValue<idx_t>(begin + bound, right_hash->count);
		while (first < last) {
			const auto mid = first + (last - first) / 2;
			right_itr->SetIndex(mid);
			if (right_itr->Compare(*left_itr)) {
				//	If right <= left, new lower bound
				first = mid + 1;
			} else {
				last = mid;
			}
		}
		right_itr->SetIndex(--first);

		//	Check partitions for strict equality
		if (right_hash->ComparePartitions(*left_itr, *right_itr)) {
			continue;
		}

		// Emit match data
		if (found_match) {
			found_match[i] = true;
		}
		if (matches) {
			matches[i] = first;
		}
		lhs_sel.set_index(lhs_match_count++, i);
	}
}